

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolyConnectivity.cc
# Opt level: O0

void __thiscall
OpenMesh::PolyConnectivity::split(PolyConnectivity *this,FaceHandle fh,VertexHandle vh)

{
  bool bVar1;
  VertexHandle VVar2;
  HalfedgeHandle HVar3;
  BaseHandle BVar4;
  FaceHandle _fh;
  HalfedgeHandle hnew;
  FaceHandle fnew;
  HalfedgeHandle hnext;
  BaseHandle local_2c;
  HalfedgeHandle hold;
  HalfedgeHandle hh;
  HalfedgeHandle hend;
  PolyConnectivity *this_local;
  VertexHandle vh_local;
  FaceHandle fh_local;
  
  hh = ArrayKernel::halfedge_handle(&this->super_ArrayKernel,fh);
  hold = ArrayKernel::next_halfedge_handle(&this->super_ArrayKernel,hh);
  VVar2 = ArrayKernel::to_vertex_handle(&this->super_ArrayKernel,hh);
  HVar3 = ArrayKernel::new_edge(&this->super_ArrayKernel,VVar2,vh);
  ArrayKernel::set_next_halfedge_handle(&this->super_ArrayKernel,hh,HVar3);
  ArrayKernel::set_face_handle(&this->super_ArrayKernel,HVar3,fh);
  local_2c.idx_ = (int)ArrayKernel::opposite_halfedge_handle(&this->super_ArrayKernel,HVar3);
  while( true ) {
    bVar1 = BaseHandle::operator!=(&hold.super_BaseHandle,&hh.super_BaseHandle);
    if (!bVar1) break;
    BVar4.idx_ = (int)ArrayKernel::next_halfedge_handle(&this->super_ArrayKernel,hold);
    _fh = ArrayKernel::new_face(&this->super_ArrayKernel);
    ArrayKernel::set_halfedge_handle(&this->super_ArrayKernel,_fh,hold);
    VVar2 = ArrayKernel::to_vertex_handle(&this->super_ArrayKernel,hold);
    HVar3 = ArrayKernel::new_edge(&this->super_ArrayKernel,VVar2,vh);
    ArrayKernel::set_next_halfedge_handle
              (&this->super_ArrayKernel,HVar3,(HalfedgeHandle)local_2c.idx_);
    ArrayKernel::set_next_halfedge_handle
              (&this->super_ArrayKernel,(HalfedgeHandle)local_2c.idx_,hold);
    ArrayKernel::set_next_halfedge_handle(&this->super_ArrayKernel,hold,HVar3);
    ArrayKernel::set_face_handle(&this->super_ArrayKernel,HVar3,_fh);
    ArrayKernel::set_face_handle(&this->super_ArrayKernel,(HalfedgeHandle)local_2c.idx_,_fh);
    ArrayKernel::set_face_handle(&this->super_ArrayKernel,hold,_fh);
    local_2c.idx_ = (int)ArrayKernel::opposite_halfedge_handle(&this->super_ArrayKernel,HVar3);
    hold.super_BaseHandle.idx_ = (BaseHandle)(BaseHandle)BVar4.idx_;
  }
  ArrayKernel::set_next_halfedge_handle(&this->super_ArrayKernel,(HalfedgeHandle)local_2c.idx_,hh);
  HVar3 = ArrayKernel::next_halfedge_handle(&this->super_ArrayKernel,hh);
  ArrayKernel::set_next_halfedge_handle
            (&this->super_ArrayKernel,HVar3,(HalfedgeHandle)local_2c.idx_);
  ArrayKernel::set_face_handle(&this->super_ArrayKernel,(HalfedgeHandle)local_2c.idx_,fh);
  ArrayKernel::set_halfedge_handle(&this->super_ArrayKernel,vh,(HalfedgeHandle)local_2c.idx_);
  return;
}

Assistant:

void PolyConnectivity::split(FaceHandle fh, VertexHandle vh)
{
  HalfedgeHandle hend = halfedge_handle(fh);
  HalfedgeHandle hh   = next_halfedge_handle(hend);

  HalfedgeHandle hold = new_edge(to_vertex_handle(hend), vh);

  set_next_halfedge_handle(hend, hold);
  set_face_handle(hold, fh);

  hold = opposite_halfedge_handle(hold);

  while (hh != hend) {

    HalfedgeHandle hnext = next_halfedge_handle(hh);

    FaceHandle fnew = new_face();
    set_halfedge_handle(fnew, hh);

    HalfedgeHandle hnew = new_edge(to_vertex_handle(hh), vh);

    set_next_halfedge_handle(hnew, hold);
    set_next_halfedge_handle(hold, hh);
    set_next_halfedge_handle(hh, hnew);

    set_face_handle(hnew, fnew);
    set_face_handle(hold, fnew);
    set_face_handle(hh,   fnew);

    hold = opposite_halfedge_handle(hnew);

    hh = hnext;
  }

  set_next_halfedge_handle(hold, hend);
  set_next_halfedge_handle(next_halfedge_handle(hend), hold);

  set_face_handle(hold, fh);

  set_halfedge_handle(vh, hold);
}